

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O3

void __thiscall
om::concurrency::queue<std::function<void_()>_>::enqueue
          (queue<std::function<void_()>_> *this,function<void_()> *item_)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)&this->_queue,
               item_);
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void enqueue(T item_)
			{
				std::lock_guard<std::mutex> lock(_mutex);
				_queue.push(std::move(item_));
				_condition.notify_one();
			}